

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

bool __thiscall
testing::internal::UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
          (UntypedFunctionMockerBase *this)

{
  byte bVar1;
  bool bVar2;
  int line;
  __shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *this_00;
  string *psVar3;
  ulong uVar4;
  ostream *poVar5;
  char *pcVar6;
  ostream *local_228;
  ostream *local_210;
  undefined1 local_200 [8];
  UntypedExpectations expectations_to_delete;
  string *expectation_name;
  stringstream ss;
  ostream aoStack_1b0 [376];
  ExpectationBase *local_38;
  ExpectationBase *untyped_expectation;
  __normal_iterator<std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
  local_28;
  __normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
  local_20;
  const_iterator it;
  bool expectations_met;
  UntypedFunctionMockerBase *this_local;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  it._M_current._7_1_ = 1;
  local_28._M_current =
       (shared_ptr<testing::internal::ExpectationBase> *)
       std::
       vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
       ::begin(&this->untyped_expectations_);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<testing::internal::ExpectationBase>const*,std::vector<std::shared_ptr<testing::internal::ExpectationBase>,std::allocator<std::shared_ptr<testing::internal::ExpectationBase>>>>
  ::__normal_iterator<std::shared_ptr<testing::internal::ExpectationBase>*>
            ((__normal_iterator<std::shared_ptr<testing::internal::ExpectationBase>const*,std::vector<std::shared_ptr<testing::internal::ExpectationBase>,std::allocator<std::shared_ptr<testing::internal::ExpectationBase>>>>
              *)&local_20,&local_28);
  while( true ) {
    untyped_expectation =
         (ExpectationBase *)
         std::
         vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
         ::end(&this->untyped_expectations_);
    bVar2 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
                        *)&untyped_expectation);
    if (!bVar2) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
               ::operator->(&local_20)->
               super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
    local_38 = std::__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>::
               get(this_00);
    bVar2 = ExpectationBase::IsOverSaturated(local_38);
    if (bVar2) {
      it._M_current._7_1_ = 0;
    }
    else {
      bVar2 = ExpectationBase::IsSatisfied(local_38);
      if (!bVar2) {
        it._M_current._7_1_ = 0;
        std::__cxx11::stringstream::stringstream((stringstream *)&expectation_name);
        psVar3 = ExpectationBase::GetDescription_abi_cxx11_(local_38);
        std::operator<<(aoStack_1b0,"Actual function ");
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          poVar5 = std::operator<<(aoStack_1b0,"\"");
          poVar5 = std::operator<<(poVar5,(string *)psVar3);
          std::operator<<(poVar5,"\" ");
        }
        poVar5 = std::operator<<(aoStack_1b0,"call count doesn\'t match ");
        pcVar6 = ExpectationBase::source_text(local_38);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,"...\n");
        local_210 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x1c0) {
          local_210 = aoStack_1b0;
        }
        (*local_38->_vptr_ExpectationBase[2])(local_38,local_210);
        local_228 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x1c0) {
          local_228 = aoStack_1b0;
        }
        ExpectationBase::DescribeCallCountTo(local_38,local_228);
        pcVar6 = ExpectationBase::file(local_38);
        line = ExpectationBase::line(local_38);
        std::__cxx11::stringstream::str();
        Expect(false,pcVar6,line,
               (string *)
               &expectations_to_delete.
                super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &expectations_to_delete.
                    super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::stringstream::~stringstream((stringstream *)&expectation_name);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
    ::operator++(&local_20);
  }
  std::
  vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ::vector((vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
            *)local_200);
  std::
  vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ::swap(&this->untyped_expectations_,
         (vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
          *)local_200);
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  std::
  vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ::clear((vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
           *)local_200);
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  bVar1 = it._M_current._7_1_;
  std::
  vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ::~vector((vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
             *)local_200);
  return (bool)(bVar1 & 1);
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  bool expectations_met = true;
  for (UntypedExpectations::const_iterator it = untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    ExpectationBase* const untyped_expectation = it->get();
    if (untyped_expectation->IsOverSaturated()) {
      // There was an upper-bound violation.  Since the error was
      // already reported when it occurred, there is no need to do
      // anything here.
      expectations_met = false;
    } else if (!untyped_expectation->IsSatisfied()) {
      expectations_met = false;
      ::std::stringstream ss;

      const ::std::string& expectation_name =
          untyped_expectation->GetDescription();
      ss << "Actual function ";
      if (!expectation_name.empty()) {
        ss << "\"" << expectation_name << "\" ";
      }
      ss << "call count doesn't match " << untyped_expectation->source_text()
         << "...\n";
      // No need to show the source file location of the expectation
      // in the description, as the Expect() call that follows already
      // takes care of it.
      untyped_expectation->MaybeDescribeExtraMatcherTo(&ss);
      untyped_expectation->DescribeCallCountTo(&ss);
      Expect(false, untyped_expectation->file(), untyped_expectation->line(),
             ss.str());
    }
  }

  // Deleting our expectations may trigger other mock objects to be deleted, for
  // example if an action contains a reference counted smart pointer to that
  // mock object, and that is the last reference. So if we delete our
  // expectations within the context of the global mutex we may deadlock when
  // this method is called again. Instead, make a copy of the set of
  // expectations to delete, clear our set within the mutex, and then clear the
  // copied set outside of it.
  UntypedExpectations expectations_to_delete;
  untyped_expectations_.swap(expectations_to_delete);

  g_gmock_mutex.Unlock();
  expectations_to_delete.clear();
  g_gmock_mutex.Lock();

  return expectations_met;
}